

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

roaring64_bitmap_t * __thiscall
anon_unknown.dwarf_41e4::test_of::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  roaring64_bitmap_t *prVar1;
  uint64_t roaring64_bitmap_from_array [4];
  
  prVar1 = roaring64_bitmap_of_ptr(1,(uint64_t *)0x0);
  return (roaring64_bitmap_t *)prVar1;
}

Assistant:

DEFINE_TEST(test_of) {
    roaring64_bitmap_t* r = roaring64_bitmap_from(1, 20000, 500000);
    assert_r64_valid(r);
    assert_true(roaring64_bitmap_contains(r, 1));
    assert_true(roaring64_bitmap_contains(r, 20000));
    assert_true(roaring64_bitmap_contains(r, 500000));
    roaring64_bitmap_free(r);
}